

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiddleVal.cpp
# Opt level: O3

MiddleVal * __thiscall MiddleVal::operator-=(MiddleVal *this,MiddleVal *t)

{
  int iVar1;
  double dVar2;
  double dVar3;
  
  iVar1 = std::__cxx11::string::compare((char *)this);
  if (iVar1 == 0) {
    dVar2 = this->dVal;
  }
  else {
    dVar2 = (double)this->iVal;
  }
  iVar1 = std::__cxx11::string::compare((char *)t);
  if (iVar1 == 0) {
    dVar3 = t->dVal;
  }
  else {
    dVar3 = (double)t->iVal;
  }
  iVar1 = std::__cxx11::string::compare((char *)this);
  if ((iVar1 != 0) && (iVar1 = std::__cxx11::string::compare((char *)t), iVar1 != 0)) {
    this->iVal = (int)(dVar2 * dVar3);
    return this;
  }
  std::__cxx11::string::_M_replace((ulong)this,0,(char *)(this->Type)._M_string_length,0x124138);
  this->dVal = dVar2 * dVar3;
  return this;
}

Assistant:

MiddleVal &MiddleVal::operator-=(MiddleVal t) {
    double result, a, b;
    if (Type == "real") {
        a = dVal;
    } else {
        a = iVal;
    }
    if (t.Type == "real") {
        b = t.dVal;
    } else {
        b = t.iVal;
    }
    result = a * b;
    if (Type == "real" || t.Type == "real") {
        Type = "real";
        dVal = result;
    } else {
        iVal = (int) result;
    }
    return *this;
}